

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void __thiscall
upb::generator::Output::operator()
          (Output *this,string_view format,basic_string_view<char,_std::char_traits<char>_> *arg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_3,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_4,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_5,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_6)

{
  string_view value;
  string_view format_00;
  Arg *this_00;
  Arg local_1e8;
  Arg local_1b8;
  Arg local_188;
  Arg local_158;
  Arg local_128;
  Arg local_f8;
  size_t local_c8;
  char *pcStack_c0;
  Arg local_b8;
  lts_20250127 *local_88;
  char *pcStack_80;
  string local_70;
  string_view local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_local_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_local_1;
  basic_string_view<char,_std::char_traits<char>_> *arg_local;
  Output *this_local;
  string_view format_local;
  
  pcStack_80 = format._M_str;
  local_88 = (lts_20250127 *)format._M_len;
  local_c8 = arg->_M_len;
  pcStack_c0 = arg->_M_str;
  value._M_len = arg->_M_len;
  value._M_str = arg->_M_str;
  local_40 = arg_2;
  arg_local_2 = arg_1;
  arg_local_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)arg;
  arg_local = (basic_string_view<char,_std::char_traits<char>_> *)this;
  this_local = (Output *)local_88;
  format_local._M_len = (size_t)pcStack_80;
  absl::lts_20250127::substitute_internal::Arg::Arg(&local_b8,value);
  absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>(&local_f8,arg_local_2);
  absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>(&local_128,local_40);
  absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>(&local_158,arg_3);
  absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>(&local_188,arg_4);
  this_00 = &local_1b8;
  absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>(this_00,arg_5);
  absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>(&local_1e8,arg_6);
  format_00._M_str = (char *)&local_b8;
  format_00._M_len = (size_t)pcStack_80;
  absl::lts_20250127::Substitute_abi_cxx11_
            (&local_70,local_88,format_00,&local_f8,&local_128,&local_158,&local_188,this_00,
             &local_1e8,this_00);
  local_50 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_70);
  Write(this,local_50);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void operator()(absl::string_view format, const Arg&... arg) {
    Write(absl::Substitute(format, arg...));
  }